

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_pack8to1_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint _c;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  size_t sVar7;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  long lVar22;
  Option *pOVar23;
  Mat *dst;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  Option *opt_00;
  uint uVar27;
  Option *opt_01;
  long lVar28;
  _func_int ***ppp_Var29;
  _func_int ***ppp_Var30;
  int iVar31;
  uint uVar32;
  _func_int ***ppp_Var33;
  _func_int ***ppp_Var34;
  undefined1 (*pauVar35) [32];
  _func_int ***ppp_Var36;
  long lVar37;
  _func_int ***ppp_Var38;
  ulong uVar39;
  undefined1 (*pauVar40) [32];
  _func_int ***ppp_Var41;
  _func_int ***ppp_Var42;
  ulong uVar43;
  _func_int ***ppp_Var44;
  float *pfVar45;
  uint _w;
  void *pvVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  Mat local_1e8;
  Option *local_1a0;
  uint local_194;
  ulong local_190;
  long local_188;
  long local_180;
  ulong local_178;
  int local_170;
  int local_16c;
  undefined1 local_168 [40];
  int iStack_140;
  int iStack_13c;
  int iStack_138;
  int iStack_134;
  int local_130;
  size_t local_128;
  Option *local_120;
  Mat *local_118;
  long local_110;
  Mat local_108;
  Mat local_b8;
  Mat *local_70;
  Mat *local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  size_t local_48;
  Allocator *local_40;
  long local_38;
  
  _c = bottom_blob->c;
  uVar43 = (ulong)_c;
  sVar7 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  iVar5 = top_blob->w;
  iVar31 = top_blob->h;
  local_1a0 = (Option *)(long)top_blob->c;
  piVar8 = bottom_blob->refcount;
  local_108.data = bottom_blob->data;
  local_108.refcount._0_4_ = (int)bottom_blob->refcount;
  local_108.refcount._4_4_ = (int)((ulong)bottom_blob->refcount >> 0x20);
  local_108.elemsize._0_4_ = (int)sVar7;
  local_108.elemsize._4_4_ = (int)(sVar7 >> 0x20);
  local_108.allocator = bottom_blob->allocator;
  uVar16 = bottom_blob->dims;
  uVar17 = bottom_blob->w;
  local_108.h = bottom_blob->h;
  local_108.d = bottom_blob->d;
  local_108.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  iVar5 = (iVar5 + 5) / 6;
  local_170 = iVar5 * 6;
  iVar31 = (iVar31 + 5) / 6;
  local_16c = iVar31 * 6;
  local_118 = kernel_tm;
  local_108.elempack = iVar4;
  local_108.dims = uVar16;
  local_108.w = uVar17;
  local_108.c = _c;
  local_70 = bias;
  local_68 = top_blob;
  copy_make_border(bottom_blob,&local_108,0,(local_16c - bottom_blob->h) + 2,0,
                   (local_170 - bottom_blob->w) + 2,0,0.0,opt);
  local_128 = 0;
  iVar31 = iVar31 * iVar5;
  local_168._0_8_ = (void *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_4_ = 0;
  local_168._20_8_ = 0;
  local_168._32_8_ = (Allocator *)0x0;
  iStack_140 = 0;
  iStack_13c = 0;
  iStack_138 = 0;
  iStack_134 = 0;
  local_130 = 0;
  local_120 = opt;
  Mat::create((Mat *)local_168,iVar31,0x40,_c,sVar7,iVar4,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack8_avx(&local_108,(Mat *)local_168,opt_01);
  pOVar23 = local_120;
  piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,(int)local_108.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_108.cstep = 0;
  local_1e8.data = (Allocator *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elempack = 0;
  local_108._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.cstep = 0;
  _w = iVar31 * 8 >> 3;
  local_1e8.cstep = 0;
  local_194 = _c * 8;
  uVar27 = (_w & 7) + (_w >> 3);
  uVar32 = local_194;
  if ((int)_w < 8) {
    uVar27 = _w;
    uVar32 = _c;
  }
  local_1e8.elemsize._4_4_ = (int)local_1e8.refcount;
  local_1e8.allocator = (Allocator *)local_1e8.data;
  local_1e8.dims = (int)local_1e8.refcount;
  local_1e8.w = local_1e8.refcount._4_4_;
  local_1e8.h = (int)local_1e8.elemsize;
  local_1e8.d = (int)local_1e8.refcount;
  local_1e8.c = local_1e8.elempack;
  local_108.data = local_1e8.data;
  local_108.refcount._0_4_ = (int)local_1e8.refcount;
  local_108.refcount._4_4_ = local_1e8.refcount._4_4_;
  local_108.elemsize._0_4_ = (int)local_1e8.elemsize;
  local_108.elemsize._4_4_ = (int)local_1e8.refcount;
  local_108.elempack = local_1e8.elempack;
  local_108.allocator = (Allocator *)local_1e8.data;
  local_108.dims = (int)local_1e8.refcount;
  local_108.w = local_1e8.elempack;
  local_108.c = local_1e8.elempack;
  local_b8.data = local_1e8.data;
  local_b8.refcount._0_4_ = (int)local_1e8.refcount;
  local_b8.refcount._4_4_ = local_1e8.refcount._4_4_;
  local_b8.elemsize._0_4_ = (int)local_1e8.elemsize;
  local_b8.elemsize._4_4_ = (int)local_1e8.refcount;
  local_b8.elempack = local_1e8.elempack;
  local_b8.allocator = (Allocator *)local_1e8.data;
  local_b8.dims = (int)local_1e8.refcount;
  local_b8.w = local_1e8.refcount._4_4_;
  local_b8._48_8_ = local_108._48_8_;
  local_b8.c = local_1e8.elempack;
  Mat::create(&local_1e8,uVar32,uVar27,0x40,sVar7,iVar4,pOVar23->workspace_allocator);
  local_188 = (long)(int)_w;
  lVar25 = 0;
  do {
    lVar22 = CONCAT44(local_1e8.elemsize._4_4_,(int)local_1e8.elemsize);
    lVar28 = local_1e8.cstep * lVar25 * lVar22;
    uVar39 = 0;
    if (7 < (int)_w) {
      uVar26 = 0;
      do {
        if (0 < (int)_c) {
          pauVar40 = (undefined1 (*) [32])
                     ((ulong)((_w * (int)lVar25 + (int)uVar26) * 8) * 4 + local_168._0_8_);
          pauVar35 = (undefined1 (*) [32])
                     ((long)(_func_int ***)local_1e8.data +
                     (uVar26 >> 3) * lVar22 * local_1e8.w + lVar28);
          uVar27 = _c;
          do {
            auVar48 = vunpcklps_avx(*pauVar40,pauVar40[1]);
            auVar53 = vunpckhps_avx(*pauVar40,pauVar40[1]);
            auVar64 = vunpcklps_avx(pauVar40[2],pauVar40[3]);
            auVar55 = vunpckhps_avx(pauVar40[2],pauVar40[3]);
            auVar49 = vunpcklps_avx(pauVar40[4],pauVar40[5]);
            auVar57 = vunpckhps_avx(pauVar40[4],pauVar40[5]);
            auVar63 = vunpcklps_avx(pauVar40[6],pauVar40[7]);
            auVar59 = vunpckhps_avx(pauVar40[6],pauVar40[7]);
            auVar61 = vunpcklpd_avx(auVar48,auVar64);
            auVar48 = vunpckhpd_avx(auVar48,auVar64);
            auVar64 = vunpcklpd_avx(auVar53,auVar55);
            auVar53 = vunpckhpd_avx(auVar53,auVar55);
            auVar66 = vunpcklpd_avx(auVar49,auVar63);
            auVar55 = vunpckhpd_avx(auVar49,auVar63);
            auVar49 = vunpcklpd_avx(auVar57,auVar59);
            auVar57 = vunpckhpd_avx(auVar57,auVar59);
            auVar63._16_16_ = auVar66._0_16_;
            auVar63._0_16_ = auVar61._0_16_;
            auVar68._16_16_ = auVar55._0_16_;
            auVar68._0_16_ = auVar48._0_16_;
            auVar69._16_16_ = auVar49._0_16_;
            auVar69._0_16_ = auVar64._0_16_;
            auVar70._16_16_ = auVar57._0_16_;
            auVar70._0_16_ = auVar53._0_16_;
            auVar59 = vperm2f128_avx(auVar61,auVar66,0x31);
            auVar48 = vperm2f128_avx(auVar48,auVar55,0x31);
            auVar55 = vperm2f128_avx(auVar64,auVar49,0x31);
            auVar53 = vperm2f128_avx(auVar53,auVar57,0x31);
            *pauVar35 = auVar63;
            pauVar35[1] = auVar68;
            pauVar35[2] = auVar69;
            pauVar35[3] = auVar70;
            pauVar35[4] = auVar59;
            pauVar35[5] = auVar48;
            pauVar35[6] = auVar55;
            pauVar35[7] = auVar53;
            pauVar40 = pauVar40 + local_128;
            pauVar35 = pauVar35 + 8;
            uVar27 = uVar27 - 1;
          } while (uVar27 != 0);
        }
        uVar39 = uVar26 + 8;
        lVar37 = uVar26 + 0xf;
        uVar26 = uVar39;
      } while (lVar37 < local_188);
    }
    if ((int)uVar39 < (int)_w) {
      uVar39 = uVar39 & 0xffffffff;
      do {
        if (0 < (int)_c) {
          pauVar35 = (undefined1 (*) [32])((uVar39 + lVar25 * local_188) * 0x20 + local_168._0_8_);
          pauVar40 = (undefined1 (*) [32])
                     ((long)(_func_int ***)local_1e8.data +
                     (ulong)(((uint)uVar39 & 7) + ((uint)(uVar39 >> 3) & 0x1fffffff)) *
                     lVar22 * local_1e8.w + lVar28);
          uVar27 = _c;
          do {
            *pauVar40 = *pauVar35;
            pauVar40 = pauVar40 + 1;
            pauVar35 = pauVar35 + local_128;
            uVar27 = uVar27 - 1;
          } while (uVar27 != 0);
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 != _w);
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x40);
  piVar8 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_168._32_8_ == (Allocator *)0x0) {
        if ((void *)local_168._0_8_ != (void *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_168._32_8_)[3])();
      }
    }
  }
  local_128 = 0;
  local_168._0_8_ = (Allocator *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_4_ = 0;
  local_168._20_8_ = 0;
  iStack_13c = 0;
  local_168._32_8_ = local_168._0_8_;
  iStack_140 = local_168._8_4_;
  iStack_138 = local_168._16_4_;
  iStack_134 = local_168._8_4_;
  local_130 = iStack_13c;
  Mat::create(&local_b8,_w,0x40,(int)local_1a0,4,1,pOVar23->workspace_allocator);
  dst = local_68;
  pOVar23 = local_120;
  iVar4 = local_16c;
  uVar27 = (int)local_1a0 >> 3;
  if (0 < (int)uVar27) {
    uVar32 = 1;
    if (1 < (int)local_194) {
      uVar32 = local_194;
    }
    local_190 = CONCAT44(local_190._4_4_,uVar32);
    local_60 = (ulong)uVar27;
    uVar39 = 0;
    do {
      local_58 = uVar39;
      lVar25 = CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize);
      ppp_Var29 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + local_58 * 8 * local_b8.cstep * lVar25);
      ppp_Var33 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 1) * local_b8.cstep * lVar25
                  );
      ppp_Var34 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 2) * local_b8.cstep * lVar25
                  );
      ppp_Var36 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 3) * local_b8.cstep * lVar25
                  );
      ppp_Var38 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 4) * local_b8.cstep * lVar25
                  );
      ppp_Var41 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 5) * local_b8.cstep * lVar25
                  );
      ppp_Var30 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 6) * local_b8.cstep * lVar25
                  );
      ppp_Var42 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data + (local_58 * 8 + 7) * local_b8.cstep * lVar25
                  );
      local_50 = (long)local_118->w * local_118->elemsize;
      pvVar46 = (void *)(local_118->elemsize * local_118->cstep * local_58 + (long)local_118->data);
      lVar25 = 0;
      do {
        local_110 = lVar25;
        uVar39 = 0;
        local_180 = (long)local_1e8.w;
        local_38 = CONCAT44(local_1e8.elemsize._4_4_,(int)local_1e8.elemsize);
        local_40 = (Allocator *)local_1e8.data;
        local_48 = local_1e8.cstep;
        if (7 < (int)_w) {
          ppp_Var44 = (_func_int ***)
                      ((long)(_func_int ***)local_1e8.data + local_1e8.cstep * local_38 * local_110)
          ;
          uVar26 = 0;
          do {
            if ((int)_c < 1) {
              auVar66 = SUB6432(ZEXT864(0),0);
              auVar64 = SUB6432(ZEXT864(0),0);
              auVar61 = SUB6432(ZEXT864(0),0);
              auVar59 = SUB6432(ZEXT864(0),0);
              auVar57 = SUB6432(ZEXT864(0),0);
              auVar55 = SUB6432(ZEXT864(0),0);
              auVar53 = SUB6432(ZEXT864(0),0);
              auVar48 = SUB6432(ZEXT864(0),0);
            }
            else {
              auVar52 = ZEXT864(0);
              lVar25 = 0;
              auVar54 = ZEXT864(0);
              auVar56 = ZEXT864(0);
              auVar58 = ZEXT864(0);
              auVar60 = ZEXT864(0);
              auVar62 = ZEXT864(0);
              auVar65 = ZEXT864(0);
              auVar67 = ZEXT864(0);
              uVar27 = uVar32;
              do {
                pfVar45 = (float *)((long)ppp_Var44 + lVar25);
                fVar9 = *pfVar45;
                fVar10 = pfVar45[1];
                fVar11 = pfVar45[2];
                fVar12 = pfVar45[3];
                fVar13 = pfVar45[4];
                fVar14 = pfVar45[5];
                fVar15 = pfVar45[6];
                fVar2 = *(float *)((long)pvVar46 + lVar25);
                fVar3 = *(float *)((long)pvVar46 + lVar25 + 4);
                auVar66._0_4_ = fVar2 * fVar9 + auVar67._0_4_;
                auVar66._4_4_ = fVar2 * fVar10 + auVar67._4_4_;
                auVar66._8_4_ = fVar2 * fVar11 + auVar67._8_4_;
                auVar66._12_4_ = fVar2 * fVar12 + auVar67._12_4_;
                auVar66._16_4_ = fVar2 * fVar13 + auVar67._16_4_;
                auVar66._20_4_ = fVar2 * fVar14 + auVar67._20_4_;
                auVar66._24_4_ = fVar2 * fVar15 + auVar67._24_4_;
                auVar66._28_4_ = fVar2 + auVar67._28_4_;
                auVar67 = ZEXT3264(auVar66);
                auVar64._0_4_ = fVar3 * fVar9 + auVar65._0_4_;
                auVar64._4_4_ = fVar3 * fVar10 + auVar65._4_4_;
                auVar64._8_4_ = fVar3 * fVar11 + auVar65._8_4_;
                auVar64._12_4_ = fVar3 * fVar12 + auVar65._12_4_;
                auVar64._16_4_ = fVar3 * fVar13 + auVar65._16_4_;
                auVar64._20_4_ = fVar3 * fVar14 + auVar65._20_4_;
                auVar64._24_4_ = fVar3 * fVar15 + auVar65._24_4_;
                auVar64._28_4_ = fVar2 + auVar65._28_4_;
                auVar65 = ZEXT3264(auVar64);
                fVar2 = *(float *)((long)pvVar46 + lVar25 + 8);
                fVar3 = *(float *)((long)pvVar46 + lVar25 + 0xc);
                auVar61._0_4_ = fVar2 * fVar9 + auVar62._0_4_;
                auVar61._4_4_ = fVar2 * fVar10 + auVar62._4_4_;
                auVar61._8_4_ = fVar2 * fVar11 + auVar62._8_4_;
                auVar61._12_4_ = fVar2 * fVar12 + auVar62._12_4_;
                auVar61._16_4_ = fVar2 * fVar13 + auVar62._16_4_;
                auVar61._20_4_ = fVar2 * fVar14 + auVar62._20_4_;
                auVar61._24_4_ = fVar2 * fVar15 + auVar62._24_4_;
                auVar61._28_4_ = fVar2 + auVar62._28_4_;
                auVar62 = ZEXT3264(auVar61);
                auVar59._0_4_ = fVar3 * fVar9 + auVar60._0_4_;
                auVar59._4_4_ = fVar3 * fVar10 + auVar60._4_4_;
                auVar59._8_4_ = fVar3 * fVar11 + auVar60._8_4_;
                auVar59._12_4_ = fVar3 * fVar12 + auVar60._12_4_;
                auVar59._16_4_ = fVar3 * fVar13 + auVar60._16_4_;
                auVar59._20_4_ = fVar3 * fVar14 + auVar60._20_4_;
                auVar59._24_4_ = fVar3 * fVar15 + auVar60._24_4_;
                auVar59._28_4_ = fVar2 + auVar60._28_4_;
                auVar60 = ZEXT3264(auVar59);
                fVar2 = *(float *)((long)pvVar46 + lVar25 + 0x10);
                fVar3 = *(float *)((long)pvVar46 + lVar25 + 0x14);
                auVar57._0_4_ = fVar2 * fVar9 + auVar58._0_4_;
                auVar57._4_4_ = fVar2 * fVar10 + auVar58._4_4_;
                auVar57._8_4_ = fVar2 * fVar11 + auVar58._8_4_;
                auVar57._12_4_ = fVar2 * fVar12 + auVar58._12_4_;
                auVar57._16_4_ = fVar2 * fVar13 + auVar58._16_4_;
                auVar57._20_4_ = fVar2 * fVar14 + auVar58._20_4_;
                auVar57._24_4_ = fVar2 * fVar15 + auVar58._24_4_;
                auVar57._28_4_ = fVar2 + auVar58._28_4_;
                auVar58 = ZEXT3264(auVar57);
                auVar55._0_4_ = fVar3 * fVar9 + auVar56._0_4_;
                auVar55._4_4_ = fVar3 * fVar10 + auVar56._4_4_;
                auVar55._8_4_ = fVar3 * fVar11 + auVar56._8_4_;
                auVar55._12_4_ = fVar3 * fVar12 + auVar56._12_4_;
                auVar55._16_4_ = fVar3 * fVar13 + auVar56._16_4_;
                auVar55._20_4_ = fVar3 * fVar14 + auVar56._20_4_;
                auVar55._24_4_ = fVar3 * fVar15 + auVar56._24_4_;
                auVar55._28_4_ = fVar2 + auVar56._28_4_;
                auVar56 = ZEXT3264(auVar55);
                fVar2 = *(float *)((long)pvVar46 + lVar25 + 0x18);
                fVar3 = *(float *)((long)pvVar46 + lVar25 + 0x1c);
                auVar53._0_4_ = fVar2 * fVar9 + auVar54._0_4_;
                auVar53._4_4_ = fVar2 * fVar10 + auVar54._4_4_;
                auVar53._8_4_ = fVar2 * fVar11 + auVar54._8_4_;
                auVar53._12_4_ = fVar2 * fVar12 + auVar54._12_4_;
                auVar53._16_4_ = fVar2 * fVar13 + auVar54._16_4_;
                auVar53._20_4_ = fVar2 * fVar14 + auVar54._20_4_;
                auVar53._24_4_ = fVar2 * fVar15 + auVar54._24_4_;
                auVar53._28_4_ = fVar2 + auVar54._28_4_;
                auVar54 = ZEXT3264(auVar53);
                auVar48._0_4_ = fVar3 * fVar9 + auVar52._0_4_;
                auVar48._4_4_ = fVar3 * fVar10 + auVar52._4_4_;
                auVar48._8_4_ = fVar3 * fVar11 + auVar52._8_4_;
                auVar48._12_4_ = fVar3 * fVar12 + auVar52._12_4_;
                auVar48._16_4_ = fVar3 * fVar13 + auVar52._16_4_;
                auVar48._20_4_ = fVar3 * fVar14 + auVar52._20_4_;
                auVar48._24_4_ = fVar3 * fVar15 + auVar52._24_4_;
                auVar48._28_4_ = pfVar45[7] + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar48);
                lVar25 = lVar25 + 0x20;
                uVar27 = uVar27 - 1;
              } while (uVar27 != 0);
            }
            *(undefined1 (*) [32])ppp_Var29 = auVar66;
            *(undefined1 (*) [32])ppp_Var33 = auVar64;
            *(undefined1 (*) [32])ppp_Var34 = auVar61;
            *(undefined1 (*) [32])ppp_Var36 = auVar59;
            *(undefined1 (*) [32])ppp_Var38 = auVar57;
            *(undefined1 (*) [32])ppp_Var41 = auVar55;
            *(undefined1 (*) [32])ppp_Var30 = auVar53;
            *(undefined1 (*) [32])ppp_Var42 = auVar48;
            ppp_Var29 = ppp_Var29 + 4;
            ppp_Var33 = ppp_Var33 + 4;
            ppp_Var34 = ppp_Var34 + 4;
            ppp_Var36 = ppp_Var36 + 4;
            ppp_Var38 = ppp_Var38 + 4;
            ppp_Var41 = ppp_Var41 + 4;
            ppp_Var30 = ppp_Var30 + 4;
            ppp_Var42 = ppp_Var42 + 4;
            uVar39 = uVar26 + 8;
            lVar25 = uVar26 + 0xf;
            ppp_Var44 = (_func_int ***)((long)ppp_Var44 + local_38 * local_180);
            uVar26 = uVar39;
          } while (lVar25 < local_188);
        }
        if ((int)uVar39 < (int)_w) {
          do {
            if ((int)_c < 1) {
              auVar49 = ZEXT832(0);
            }
            else {
              auVar52 = ZEXT864(0);
              lVar25 = 0;
              uVar27 = uVar32;
              do {
                fVar2 = *(float *)((long)(_func_int ***)local_1e8.data +
                                  lVar25 + ((ulong)(((uint)uVar39 & 7) +
                                                   ((uint)(uVar39 >> 3) & 0x1fffffff)) * local_180 +
                                           local_1e8.cstep * local_110) * local_38);
                pfVar45 = (float *)((long)pvVar46 + lVar25 * 8);
                auVar49._0_4_ = fVar2 * *pfVar45 + auVar52._0_4_;
                auVar49._4_4_ = fVar2 * pfVar45[1] + auVar52._4_4_;
                auVar49._8_4_ = fVar2 * pfVar45[2] + auVar52._8_4_;
                auVar49._12_4_ = fVar2 * pfVar45[3] + auVar52._12_4_;
                auVar49._16_4_ = fVar2 * pfVar45[4] + auVar52._16_4_;
                auVar49._20_4_ = fVar2 * pfVar45[5] + auVar52._20_4_;
                auVar49._24_4_ = fVar2 * pfVar45[6] + auVar52._24_4_;
                auVar49._28_4_ = fVar2 + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar49);
                lVar25 = lVar25 + 4;
                uVar27 = uVar27 - 1;
              } while (uVar27 != 0);
            }
            *(int *)ppp_Var29 = auVar49._0_4_;
            auVar47 = auVar49._0_16_;
            uVar6 = vextractps_avx(auVar47,1);
            *(undefined4 *)ppp_Var33 = uVar6;
            uVar6 = vextractps_avx(auVar47,2);
            *(undefined4 *)ppp_Var34 = uVar6;
            uVar6 = vextractps_avx(auVar47,3);
            *(undefined4 *)ppp_Var36 = uVar6;
            auVar47 = auVar49._16_16_;
            *(int *)ppp_Var38 = auVar49._16_4_;
            uVar6 = vextractps_avx(auVar47,1);
            *(undefined4 *)ppp_Var41 = uVar6;
            uVar6 = vextractps_avx(auVar47,2);
            *(undefined4 *)ppp_Var30 = uVar6;
            uVar6 = vextractps_avx(auVar47,3);
            *(undefined4 *)ppp_Var42 = uVar6;
            ppp_Var29 = (_func_int ***)((long)ppp_Var29 + 4);
            ppp_Var33 = (_func_int ***)((long)ppp_Var33 + 4);
            ppp_Var34 = (_func_int ***)((long)ppp_Var34 + 4);
            ppp_Var36 = (_func_int ***)((long)ppp_Var36 + 4);
            ppp_Var38 = (_func_int ***)((long)ppp_Var38 + 4);
            ppp_Var41 = (_func_int ***)((long)ppp_Var41 + 4);
            ppp_Var30 = (_func_int ***)((long)ppp_Var30 + 4);
            ppp_Var42 = (_func_int ***)((long)ppp_Var42 + 4);
            uVar27 = (uint)uVar39 + 1;
            uVar39 = (ulong)uVar27;
          } while (uVar27 != _w);
        }
        pvVar46 = (void *)((long)pvVar46 + local_50);
        lVar25 = local_110 + 1;
      } while (local_110 + 1 != 0x40);
      uVar39 = local_58 + 1;
    } while (local_58 + 1 != local_60);
  }
  uVar39 = (ulong)local_1a0 & 0xfffffffffffffff8;
  if ((int)uVar39 != (int)local_1a0) {
    uVar27 = 1;
    if (1 < (int)local_194) {
      uVar27 = local_194;
    }
    do {
      local_190 = uVar39;
      ppp_Var29 = (_func_int ***)
                  ((long)(_func_int ***)local_b8.data +
                  local_b8.cstep * local_190 *
                  CONCAT44(local_b8.elemsize._4_4_,(int)local_b8.elemsize));
      uVar32 = (uint)local_190;
      uVar24 = uVar32 + 7;
      if (-1 < (int)uVar32) {
        uVar24 = uVar32;
      }
      iVar5 = local_118->w;
      sVar7 = local_118->elemsize;
      pvVar46 = (void *)((long)(int)(((int)uVar24 >> 3) + (uVar32 - (uVar24 & 0xfffffff8))) *
                         local_118->cstep * sVar7 + (long)local_118->data);
      lVar25 = 0;
      do {
        lVar22 = CONCAT44(local_1e8.elemsize._4_4_,(int)local_1e8.elemsize);
        uVar39 = 0;
        if (7 < (int)_w) {
          uVar26 = 0;
          do {
            if ((int)_c < 1) {
              auVar50 = SUB6432(ZEXT864(0),0);
            }
            else {
              pfVar45 = (float *)((long)(_func_int ***)local_1e8.data +
                                 (uVar26 >> 3) * lVar22 * local_1e8.w +
                                 local_1e8.cstep * lVar25 * lVar22);
              auVar52 = ZEXT864(0);
              lVar28 = 0;
              do {
                fVar2 = *(float *)((long)pvVar46 + lVar28 * 4);
                auVar50._0_4_ = fVar2 * *pfVar45 + auVar52._0_4_;
                auVar50._4_4_ = fVar2 * pfVar45[1] + auVar52._4_4_;
                auVar50._8_4_ = fVar2 * pfVar45[2] + auVar52._8_4_;
                auVar50._12_4_ = fVar2 * pfVar45[3] + auVar52._12_4_;
                auVar50._16_4_ = fVar2 * pfVar45[4] + auVar52._16_4_;
                auVar50._20_4_ = fVar2 * pfVar45[5] + auVar52._20_4_;
                auVar50._24_4_ = fVar2 * pfVar45[6] + auVar52._24_4_;
                auVar50._28_4_ = fVar2 + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar50);
                pfVar45 = pfVar45 + 8;
                lVar28 = lVar28 + 1;
              } while (uVar27 != (uint)lVar28);
            }
            *(undefined1 (*) [32])ppp_Var29 = auVar50;
            ppp_Var29 = ppp_Var29 + 4;
            uVar39 = uVar26 + 8;
            lVar28 = uVar26 + 0xf;
            uVar26 = uVar39;
          } while (lVar28 < local_188);
        }
        if ((int)uVar39 < (int)_w) {
          do {
            if ((int)_c < 1) {
              auVar51 = ZEXT832(0);
            }
            else {
              auVar52 = ZEXT864(0);
              lVar28 = 0;
              uVar26 = uVar43;
              do {
                pfVar45 = (float *)((long)pvVar46 + lVar28);
                pfVar1 = (float *)((long)(_func_int ***)local_1e8.data +
                                  lVar28 + ((ulong)(((uint)uVar39 & 7) +
                                                   ((uint)(uVar39 >> 3) & 0x1fffffff)) *
                                            (long)local_1e8.w + local_1e8.cstep * lVar25) * lVar22);
                auVar51._0_4_ = *pfVar45 * *pfVar1 + auVar52._0_4_;
                auVar51._4_4_ = pfVar45[1] * pfVar1[1] + auVar52._4_4_;
                auVar51._8_4_ = pfVar45[2] * pfVar1[2] + auVar52._8_4_;
                auVar51._12_4_ = pfVar45[3] * pfVar1[3] + auVar52._12_4_;
                auVar51._16_4_ = pfVar45[4] * pfVar1[4] + auVar52._16_4_;
                auVar51._20_4_ = pfVar45[5] * pfVar1[5] + auVar52._20_4_;
                auVar51._24_4_ = pfVar45[6] * pfVar1[6] + auVar52._24_4_;
                auVar51._28_4_ = pfVar45[7] + auVar52._28_4_;
                auVar52 = ZEXT3264(auVar51);
                lVar28 = lVar28 + 0x20;
                uVar32 = (int)uVar26 - 1;
                uVar26 = (ulong)uVar32;
              } while (uVar32 != 0);
            }
            auVar47 = vhaddps_avx(auVar51._16_16_,auVar51._0_16_);
            auVar47 = vhaddps_avx(auVar47,auVar47);
            auVar47 = vhaddps_avx(auVar47,auVar47);
            *(int *)ppp_Var29 = auVar47._0_4_;
            ppp_Var29 = (_func_int ***)((long)ppp_Var29 + 4);
            uVar32 = (uint)uVar39 + 1;
            uVar39 = (ulong)uVar32;
          } while (uVar32 != _w);
        }
        lVar25 = lVar25 + 1;
        pvVar46 = (void *)((long)pvVar46 + (long)iVar5 * sVar7);
      } while (lVar25 != 0x40);
      uVar39 = local_190 + 1;
    } while ((long)(local_190 + 1) < (long)local_1a0);
  }
  piVar8 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
  local_178 = uVar43;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1e8.data != (Allocator *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  piVar8 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_168._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_168._0_8_ != (Allocator *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_168._32_8_)[3])();
      }
    }
  }
  local_128 = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_4_ = 0;
  local_168._20_8_ = 0;
  opt_00 = (Option *)(local_168 + 0x20);
  iStack_138 = 0;
  iStack_134 = 0;
  local_130 = 0;
  local_168._32_8_ = (Allocator *)0x0;
  iStack_140 = 0;
  iStack_13c = 0;
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  if ((local_170 == dst->w) && (iVar4 == dst->h)) {
    if (&local_1e8 != dst) {
      piVar8 = dst->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_128 = 0;
      local_130 = 0;
      iStack_134 = 0;
      iStack_138 = 0;
      iStack_13c = 0;
      iStack_140 = 0;
      local_168._32_8_ = (Allocator *)0x0;
      local_168._20_8_ = 0;
      local_168._16_4_ = 0;
      local_168._12_4_ = 0;
      local_168._8_4_ = 0;
      local_168._0_8_ = (void *)0x0;
      local_1e8.data = dst->data;
      local_1e8.refcount._0_4_ = (int)dst->refcount;
      local_1e8.refcount._4_4_ = (int)((ulong)dst->refcount >> 0x20);
      local_1e8.elemsize._0_4_ = (int)dst->elemsize;
      local_1e8.elemsize._4_4_ = (int)(dst->elemsize >> 0x20);
      local_1e8.elempack = dst->elempack;
      local_1e8.allocator = dst->allocator;
      uVar18 = dst->dims;
      uVar19 = dst->w;
      uVar20 = dst->h;
      uVar21 = dst->d;
      local_1e8.c = dst->c;
      local_1e8.cstep = dst->cstep;
      local_1e8.dims = uVar18;
      local_1e8.w = uVar19;
      local_1e8.h = uVar20;
      local_1e8.d = uVar21;
    }
  }
  else {
    opt_00 = local_1a0;
    Mat::create(&local_1e8,local_170,iVar4,(int)local_1a0,4,1,pOVar23->workspace_allocator);
  }
  conv3x3s1_winograd63_transform_output_sse(&local_b8,&local_1e8,local_70,opt_00);
  copy_cut_border(&local_1e8,dst,0,local_1e8.h - dst->h,0,local_1e8.w - dst->w,pOVar23);
  piVar8 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8.elemsize._4_4_ = 0;
  local_1e8.elempack = 0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  piVar8 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar8 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_168._32_8_ == (Allocator *)0x0) {
        if ((void *)local_168._0_8_ != (void *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_168._32_8_)[3])();
      }
    }
  }
  local_128 = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_4_ = 0;
  local_168._20_8_ = 0;
  iStack_140 = 0;
  iStack_13c = 0;
  iStack_138 = 0;
  iStack_134 = 0;
  local_130 = 0;
  piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,(int)local_108.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_108.data != (Allocator *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 6 * 8;
        int h_tm = outh / 6 * 8;

        const int tiles = h_tm / 8 * w_tm / 8;

        // permute
        //         bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        Mat bottom_blob_tm2;
        if (tiles >= 8)
            bottom_blob_tm2.create(8 * inch, tiles / 8 + tiles % 8, 64, elemsize, elempack, opt.workspace_allocator);
        else // if (tiles >= 1)
            bottom_blob_tm2.create(1 * inch, tiles, 64, elemsize, elempack, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int r = 0; r < 64; r++)
        {
            Mat tm2 = bottom_blob_tm2.channel(r);

            // tile
            int i = 0;
            for (; i + 7 < tiles; i += 8)
            {
                float* tmpptr = tm2.row(i / 8);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 8;

                for (int q = 0; q < inch; q++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(r0);
                    __m256 _r1 = _mm256_load_ps(r0 + 8);
                    __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    tmpptr += 64;
                    r0 += bottom_blob_tm.cstep * 8;
                }
            }
            for (; i < tiles; i++)
            {
                float* tmpptr = tm2.row(i / 8 + i % 8);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 8;

                for (int q = 0; q < inch; q++)
                {
                    __m256 _val = _mm256_load_ps(r0);
                    _mm256_store_ps(tmpptr, _val);

                    tmpptr += 8;
                    r0 += bottom_blob_tm.cstep * 8;
                }
            }
        }

        bottom_blob_tm = Mat();
        // permute end

        top_blob_tm.create(tiles, 64, outch, 4u, 1, opt.workspace_allocator);

        int nn_outch = outch >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 8;

            float* outptr0_tm = top_blob_tm.channel(p);
            float* outptr1_tm = top_blob_tm.channel(p + 1);
            float* outptr2_tm = top_blob_tm.channel(p + 2);
            float* outptr3_tm = top_blob_tm.channel(p + 3);
            float* outptr4_tm = top_blob_tm.channel(p + 4);
            float* outptr5_tm = top_blob_tm.channel(p + 5);
            float* outptr6_tm = top_blob_tm.channel(p + 6);
            float* outptr7_tm = top_blob_tm.channel(p + 7);

            const Mat kernel01_tm = kernel_tm.channel(p / 8);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 8; // inch always > 0

                    __m256 _sum0 = _mm256_setzero_ps();
                    __m256 _sum1 = _mm256_setzero_ps();
                    __m256 _sum2 = _mm256_setzero_ps();
                    __m256 _sum3 = _mm256_setzero_ps();
                    __m256 _sum4 = _mm256_setzero_ps();
                    __m256 _sum5 = _mm256_setzero_ps();
                    __m256 _sum6 = _mm256_setzero_ps();
                    __m256 _sum7 = _mm256_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m256 _val0 = _mm256_load_ps(r0);

                        __m256 _w0 = _mm256_broadcast_ss(kptr);
                        __m256 _w1 = _mm256_broadcast_ss(kptr + 1);
                        _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                        _sum1 = _mm256_comp_fmadd_ps(_val0, _w1, _sum1);
                        __m256 _w2 = _mm256_broadcast_ss(kptr + 2);
                        __m256 _w3 = _mm256_broadcast_ss(kptr + 3);
                        _sum2 = _mm256_comp_fmadd_ps(_val0, _w2, _sum2);
                        _sum3 = _mm256_comp_fmadd_ps(_val0, _w3, _sum3);
                        __m256 _w4 = _mm256_broadcast_ss(kptr + 4);
                        __m256 _w5 = _mm256_broadcast_ss(kptr + 5);
                        _sum4 = _mm256_comp_fmadd_ps(_val0, _w4, _sum4);
                        _sum5 = _mm256_comp_fmadd_ps(_val0, _w5, _sum5);
                        __m256 _w6 = _mm256_broadcast_ss(kptr + 6);
                        __m256 _w7 = _mm256_broadcast_ss(kptr + 7);
                        _sum6 = _mm256_comp_fmadd_ps(_val0, _w6, _sum6);
                        _sum7 = _mm256_comp_fmadd_ps(_val0, _w7, _sum7);

                        r0 += 8;
                        kptr += 8;
                    }

                    _mm256_storeu_ps(outptr0_tm, _sum0);
                    _mm256_storeu_ps(outptr1_tm, _sum1);
                    _mm256_storeu_ps(outptr2_tm, _sum2);
                    _mm256_storeu_ps(outptr3_tm, _sum3);
                    _mm256_storeu_ps(outptr4_tm, _sum4);
                    _mm256_storeu_ps(outptr5_tm, _sum5);
                    _mm256_storeu_ps(outptr6_tm, _sum6);
                    _mm256_storeu_ps(outptr7_tm, _sum7);

                    outptr0_tm += 8;
                    outptr1_tm += 8;
                    outptr2_tm += 8;
                    outptr3_tm += 8;
                    outptr4_tm += 8;
                    outptr5_tm += 8;
                    outptr6_tm += 8;
                    outptr7_tm += 8;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + i % 8);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 8; // inch always > 0

                    __m256 _sum = _mm256_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m256 _val0 = _mm256_broadcast_ss(r0);
                        __m256 _w0 = _mm256_load_ps(kptr);
                        _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                        r0 += 1;
                        kptr += 8;
                    }

                    float sum[8];
                    _mm256_storeu_ps(sum, _sum);

                    outptr0_tm[0] = sum[0];
                    outptr1_tm[0] = sum[1];
                    outptr2_tm[0] = sum[2];
                    outptr3_tm[0] = sum[3];
                    outptr4_tm[0] = sum[4];
                    outptr5_tm[0] = sum[5];
                    outptr6_tm[0] = sum[6];
                    outptr7_tm[0] = sum[7];

                    outptr0_tm += 1;
                    outptr1_tm += 1;
                    outptr2_tm += 1;
                    outptr3_tm += 1;
                    outptr4_tm += 1;
                    outptr5_tm += 1;
                    outptr6_tm += 1;
                    outptr7_tm += 1;
                }
            }
        }

        int remain_outch_start = nn_outch << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            float* outptr0_tm = top_blob_tm.channel(p);

            const Mat kernel0_tm = kernel_tm.channel(p / 8 + p % 8);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel0_tm.row(r);

                    int nn = inch * 8; // inch always > 0

                    __m256 _sum0 = _mm256_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m256 _val0 = _mm256_load_ps(r0);
                        __m256 _w0 = _mm256_broadcast_ss(kptr);
                        _sum0 = _mm256_comp_fmadd_ps(_w0, _val0, _sum0);

                        r0 += 8;
                        kptr += 1;
                    }

                    _mm256_storeu_ps(outptr0_tm, _sum0);
                    outptr0_tm += 8;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + i % 8);

                    const float* kptr = kernel0_tm.row(r);

                    __m256 _sum0 = _mm256_setzero_ps();

                    for (int q = 0; q < inch; q++)
                    {
                        __m256 _val0 = _mm256_load_ps(r0);
                        __m256 _w0 = _mm256_load_ps(kptr);
                        _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                        r0 += 8;
                        kptr += 8;
                    }

                    float sum0 = _mm256_reduce_add_ps(_sum0);

                    outptr0_tm[0] = sum0;
                    outptr0_tm++;
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, 1, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}